

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_zlib_decompress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGDecompressSettings *settings)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  long lVar10;
  
  uVar3 = 0x35;
  if (1 < insize) {
    bVar2 = *in;
    uVar3 = 0x18;
    if ((((ushort)(CONCAT11(bVar2,in[1]) * 0x7bdf) < 0x843) &&
        (uVar3 = 0x19, -1 < (char)bVar2 && (bVar2 & 0xf) == 8)) &&
       (uVar3 = 0x1a, (in[1] & 0x20) == 0)) {
      if (settings->custom_inflate ==
          (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0)
      {
        uVar3 = lodepng_inflate(out,outsize,in + 2,insize - 2,settings);
      }
      else {
        uVar3 = (*settings->custom_inflate)(out,outsize,in + 2,insize - 2,settings);
      }
      if (uVar3 == 0) {
        if (settings->ignore_adler32 == 0) {
          uVar4 = swap_bytes(*(undefined4 *)(in + (insize - 4)));
          uVar3 = (uint)*outsize;
          if (uVar3 == 0) {
            uVar7 = 1;
          }
          else {
            puVar8 = *out;
            uVar7 = 1;
            uVar5 = 0;
            do {
              uVar9 = 0x15ae;
              if (uVar3 < 0x15ae) {
                uVar9 = (ulong)uVar3;
                uVar6 = uVar3;
              }
              else {
                uVar6 = 0x15ae;
              }
              lVar10 = 0;
              do {
                pbVar1 = puVar8 + lVar10;
                lVar10 = lVar10 + 1;
                uVar7 = uVar7 + *pbVar1;
                uVar5 = uVar5 + uVar7;
              } while (uVar6 != (uint)lVar10);
              puVar8 = puVar8 + uVar9;
              uVar7 = uVar7 % 0xfff1;
              uVar5 = uVar5 % 0xfff1;
              uVar3 = uVar3 - (int)uVar9;
            } while (uVar3 != 0);
            uVar7 = uVar5 << 0x10 | uVar7;
          }
          if (uVar7 != uVar4) {
            return 0x3a;
          }
        }
        uVar3 = 0;
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned lodepng_zlib_decompress(unsigned char** out, size_t* outsize, const unsigned char* in,
                                 size_t insize, const LodePNGDecompressSettings* settings)
{
  unsigned error = 0;
  unsigned CM, CINFO, FDICT;

  if(insize < 2) return 53; /*error, size of zlib data too small*/
  /*read information from zlib header*/
  if((in[0] * 256 + in[1]) % 31 != 0)
  {
    /*error: 256 * in[0] + in[1] must be a multiple of 31, the FCHECK value is supposed to be made that way*/
    return 24;
  }

  CM = in[0] & 15;
  CINFO = (in[0] >> 4) & 15;
  /*FCHECK = in[1] & 31;*/ /*FCHECK is already tested above*/
  FDICT = (in[1] >> 5) & 1;
  /*FLEVEL = (in[1] >> 6) & 3;*/ /*FLEVEL is not used here*/

  if(CM != 8 || CINFO > 7)
  {
    /*error: only compression method 8: inflate with sliding window of 32k is supported by the PNG spec*/
    return 25;
  }
  if(FDICT != 0)
  {
    /*error: the specification of PNG says about the zlib stream:
      "The additional flags shall not specify a preset dictionary."*/
    return 26;
  }

  error = inflate(out, outsize, in + 2, insize - 2, settings);
  if(error) return error;

  if(!settings->ignore_adler32)
  {
    unsigned ADLER32 = lodepng_read32bitInt(&in[insize - 4]);
    unsigned checksum = adler32(*out, (unsigned)(*outsize));
    if(checksum != ADLER32) return 58; /*error, adler checksum not correct, data must be corrupted*/
  }

  return 0; /*no error*/
}